

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SW2048Game.cpp
# Opt level: O2

bool __thiscall SW2048Game::copyToLast(SW2048Game *this)

{
  int **ppiVar1;
  int **ppiVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  int x;
  long lVar6;
  
  iVar5 = this->order;
  bVar3 = false;
  for (lVar4 = 0; lVar4 < iVar5; lVar4 = lVar4 + 1) {
    ppiVar1 = this->last;
    ppiVar2 = this->board;
    for (lVar6 = 0; lVar6 < iVar5; lVar6 = lVar6 + 1) {
      if (ppiVar1[lVar4][lVar6] != ppiVar2[lVar4][lVar6]) {
        ppiVar1[lVar4][lVar6] = ppiVar2[lVar4][lVar6];
        iVar5 = this->order;
        bVar3 = true;
      }
    }
  }
  return bVar3;
}

Assistant:

bool SW2048Game::copyToLast() {
	bool result = false;
	for(int y = 0; y<order; y++)
		for (int x = 0; x < order; x++) {
			if (last[y][x] != board[y][x]) {
				last[y][x] = board[y][x];
				result = true;
			}
		}
	return result;
}